

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

Type Fixpp::
     get<Fixpp::TagT<108u,Fixpp::Type::Int>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
               (VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                *message)

{
  bool bVar1;
  runtime_error *this;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  *this_00;
  Type TVar2;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message_local;
  
  bVar1 = std::bitset<7UL>::test
                    (&(message->
                      super_MessageRef<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                      ).
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                      .allBits,1);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Bad tag access: tag is not present in message");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = meta::
            get<1ul,Fixpp::FieldRef<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<95u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<141u,Fixpp::Type::Boolean>>,Fixpp::FieldRef<Fixpp::TagT<383u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                      ((tuple<Fixpp::FieldRef<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<141U,_Fixpp::Type::Boolean>_>,_Fixpp::FieldRef<Fixpp::TagT<383U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                        *)message);
  TVar2 = FieldRef<Fixpp::TagT<108U,_Fixpp::Type::Int>_>::get(this_00);
  return TVar2;
}

Assistant:

decltype(auto)
    get(const Message& message)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            throw std::runtime_error("Bad tag access: tag is not present in message");

        return meta::get<Index::Value>(message.values).get();
    }